

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ast.cpp
# Opt level: O2

void __thiscall PrintAST::visit(PrintAST *this,FormalListNode *node)

{
  TypeNode *pTVar1;
  PointerNode *pPVar2;
  TokenNode *pTVar3;
  ArrayNode *pAVar4;
  FormalListNode *pFVar5;
  
  printAST(this,"FORMAL_LIST");
  this->level = this->level + 1;
  pTVar1 = node->type;
  if (pTVar1 != (TypeNode *)0x0) {
    (*(pTVar1->super_ASTNode)._vptr_ASTNode[3])(pTVar1,this);
  }
  pPVar2 = node->pointer;
  if (pPVar2 != (PointerNode *)0x0) {
    (*(pPVar2->super_ASTNode)._vptr_ASTNode[3])(pPVar2,this);
  }
  pTVar3 = node->id;
  if (pTVar3 != (TokenNode *)0x0) {
    (*(pTVar3->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar3,this);
  }
  pAVar4 = node->array;
  if (pAVar4 != (ArrayNode *)0x0) {
    (*(pAVar4->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pAVar4,this);
  }
  pFVar5 = node->next;
  if (pFVar5 != (FormalListNode *)0x0) {
    (*(pFVar5->super_ASTNode)._vptr_ASTNode[3])(pFVar5,this);
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void PrintAST::visit(FormalListNode *node) {
    this->printAST("FORMAL_LIST");
    up_level();
    if (node->getType() != nullptr) {
        node->getType()->accept(this);
    }
    if (node->getPointer() != nullptr) {
        node->getPointer()->accept(this);
    }
    if (node->getId() != nullptr) {
        node->getId()->accept(this);
    }
    if (node->getArray() != nullptr) {
        node->getArray()->accept(this);
    }
    if (node->getNext() != nullptr) {
        node->getNext()->accept(this);
    }
    down_level();
}